

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O2

void __thiscall argsman_tests::util_ArgsMerge::test_method(util_ArgsMerge *this)

{
  char cVar1;
  char cVar2;
  char cVar3;
  int iVar4;
  string arg;
  pointer pbVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  char *pcVar9;
  system_error *this_00;
  int *piVar10;
  error_category *peVar11;
  _Base_ptr p_Var12;
  size_t sVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  long lVar17;
  long lVar18;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  iterator in_R8;
  string *psVar19;
  iterator pvVar20;
  string *in_R9;
  string *psVar21;
  iterator pvVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *conf_val;
  pointer this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar23;
  long in_FS_OFFSET;
  bool bVar24;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  initializer_list<const_char_*> __l;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  Span<unsigned_char> output;
  Span<const_unsigned_char> s;
  const_string file_09;
  undefined4 in_stack_fffffffffffff6c8;
  undefined4 in_stack_fffffffffffff6cc;
  char *in_stack_fffffffffffff6d0;
  char *in_stack_fffffffffffff6d8;
  undefined8 in_stack_fffffffffffff6e0;
  FILE *local_910;
  char *local_8c8;
  char *local_8c0;
  undefined1 *local_8b8;
  undefined1 *local_8b0;
  char *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  char *local_880;
  undefined1 *local_878;
  undefined1 *local_870;
  char *local_868;
  char *local_860;
  _Rb_tree_node_base local_858;
  char *local_838;
  char *local_830;
  _Rb_tree_node_base local_828;
  char *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  undefined1 *local_7e8;
  undefined1 *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  undefined1 *local_7b8;
  undefined1 *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  char *local_730;
  undefined1 *local_728;
  undefined1 *local_720;
  char *local_718;
  char *local_710;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char local_6d6 [6];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  CHash256 out_sha;
  Action local_658 [4];
  Action local_648 [4];
  string local_638 [4];
  undefined1 local_5b8 [32];
  string local_598;
  string local_578;
  string local_558;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ignored;
  _Alloc_hider local_508;
  element_type *local_500;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4f8;
  undefined1 local_4e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4d8;
  string out_sha_hex;
  string conf;
  string error;
  string local_308 [32];
  string key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  string desc;
  uchar out_sha_bytes [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [10];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CSHA256::CSHA256(&out_sha.sha);
  pcVar9 = getenv("ARGS_MERGE_TEST_OUT");
  if (pcVar9 == (char *)0x0) {
    local_910 = (FILE *)0x0;
LAB_0022ed24:
    local_658[2] = NONE;
    local_658[0] = NONE;
    local_658[1] = NONE;
    bVar7 = false;
    lVar17 = 0;
    iVar8 = -1;
LAB_0022ed52:
    do {
      if (lVar17 != 0xc) {
        iVar4 = *(int *)((long)local_658 + lVar17);
        if (iVar4 == iVar8) {
          bVar7 = true;
        }
        bVar24 = 0xfffffffd < iVar4 - 3U;
        in_R8 = (iterator)CONCAT71((int7)((ulong)in_R8 >> 8),bVar24);
        lVar17 = lVar17 + 4;
        iVar8 = iVar4;
        if ((bool)(bVar24 & (bVar7 ^ 1U))) goto LAB_0022ed52;
      }
      if (!bVar7) {
        local_648[2] = NONE;
        local_648[0] = NONE;
        local_648[1] = NONE;
        bVar7 = false;
        lVar17 = 0;
        iVar8 = -1;
LAB_0022edc8:
        do {
          if (lVar17 != 0xc) {
            iVar4 = *(int *)((long)local_648 + lVar17);
            if (iVar4 == iVar8) {
              bVar7 = true;
            }
            bVar24 = 0xfffffffb < iVar4 - 5U;
            in_R8 = (iterator)CONCAT71((int7)((ulong)in_R8 >> 8),bVar24);
            lVar17 = lVar17 + 4;
            iVar8 = iVar4;
            if ((bool)(bVar24 & (bVar7 ^ 1U))) goto LAB_0022edc8;
          }
          if (!bVar7) {
            local_6d6[4] = '\0';
            local_6d6[5] = '\x01';
            for (lVar17 = 0; lVar17 != 2; lVar17 = lVar17 + 1) {
              cVar1 = local_6d6[lVar17 + 4];
              local_6d6[2] = '\0';
              local_6d6[3] = '\x01';
              for (lVar16 = 0; lVar16 != 2; lVar16 = lVar16 + 1) {
                cVar2 = local_6d6[lVar16 + 2];
                ChainTypeToString_abi_cxx11_((string *)local_5b8,MAIN);
                ChainTypeToString_abi_cxx11_(&local_598,TESTNET);
                ChainTypeToString_abi_cxx11_(&local_578,TESTNET4);
                ChainTypeToString_abi_cxx11_(&local_558,SIGNET);
                for (lVar15 = 0; lVar15 != 0x80; lVar15 = lVar15 + 0x20) {
                  ChainTypeToString_abi_cxx11_(local_638,MAIN);
                  ChainTypeToString_abi_cxx11_(local_638 + 1,TESTNET);
                  ChainTypeToString_abi_cxx11_(local_638 + 2,TESTNET4);
                  ChainTypeToString_abi_cxx11_(local_638 + 3,SIGNET);
                  for (lVar14 = 0; lVar14 != 0x80; lVar14 = lVar14 + 0x20) {
                    __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&local_638[0]._M_dataplus._M_p + lVar14);
                    local_6d6[0] = '\0';
                    local_6d6[1] = '\x01';
                    for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
                      cVar3 = local_6d6[lVar18];
                      TestArgsManager::TestArgsManager((TestArgsManager *)out_sha_bytes);
                      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                                (&criticalblock21,
                                 (AnnotatedMixin<std::recursive_mutex> *)out_sha_bytes,
                                 "parser.cs_args",
                                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                                 ,0x337,false);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&desc,"net=",(allocator<char> *)&out_sha_hex);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&desc,__str);
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                                (local_188,__str);
                      pcVar9 = "server";
                      if (cVar3 != '\0') {
                        pcVar9 = "wallet";
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_2c8,pcVar9,(allocator<char> *)&out_sha_hex);
                      std::operator+(&key,"-",&local_2c8);
                      out_sha_hex._M_dataplus._M_p =
                           out_sha_hex._M_dataplus._M_p & 0xffffffff00000000;
                      ArgsManager::AddArg((ArgsManager *)out_sha_bytes,&key,&local_2c8,1,
                                          (OptionsCategory *)&out_sha_hex);
                      if (cVar3 != '\0') {
                        std::__cxx11::string::string(local_308,&key);
                        arg._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff6cc;
                        arg._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff6c8;
                        arg._M_string_length = (size_type)in_stack_fffffffffffff6d0;
                        arg.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff6d8;
                        arg.field_2._8_8_ = in_stack_fffffffffffff6e0;
                        TestArgsManager::SetNetworkOnlyArg((TestArgsManager *)out_sha_bytes,arg);
                        std::__cxx11::string::~string(local_308);
                      }
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&out_sha_hex,"a",(allocator<char> *)&ignored);
                      psVar19 = &local_2c8;
                      psVar21 = &out_sha_hex;
                      ArgsMergeTestingSetup::GetValues
                                (&args,&this->super_ArgsMergeTestingSetup,(ActionList *)local_658,
                                 (string *)(local_5b8 + lVar15),psVar19,&out_sha_hex);
                      std::__cxx11::string::~string((string *)&out_sha_hex);
                      out_sha_hex._M_dataplus._M_p = "ignored";
                      __l._M_len = 1;
                      __l._M_array = (iterator)&out_sha_hex;
                      std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
                                (&argv,__l,(allocator_type *)&ignored);
                      pbVar5 = args.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                      for (this_02 = args.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start; this_02 != pbVar5;
                          this_02 = this_02 + 1) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                                  (this_02,0,"-");
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc," ");
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc,this_02);
                        out_sha_hex._M_dataplus._M_p = (this_02->_M_dataplus)._M_p;
                        std::vector<char_const*,std::allocator<char_const*>>::
                        emplace_back<char_const*>
                                  ((vector<char_const*,std::allocator<char_const*>> *)&argv,
                                   (char **)&out_sha_hex);
                      }
                      error._M_dataplus._M_p = (pointer)&error.field_2;
                      error._M_string_length = 0;
                      error.field_2._M_local_buf[0] = '\0';
                      local_718 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                      ;
                      local_710 = "";
                      local_728 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_720 = &boost::unit_test::basic_cstring<char_const>::null;
                      msg.m_end = (iterator)psVar21;
                      msg.m_begin = (iterator)psVar19;
                      file.m_end = (iterator)0x34b;
                      file.m_begin = (iterator)&local_718;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
                                 (size_t)&local_728,msg);
                      bVar7 = ArgsManager::ParseParameters
                                        ((ArgsManager *)out_sha_bytes,
                                         (int)((ulong)((long)argv.
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)argv.
                                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3),
                                         argv.
                                         super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start,&error);
                      ignored._M_t._M_impl._0_1_ = bVar7;
                      ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
                      ignored._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
                      ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                           (_Base_ptr)0x0;
                      conf._M_dataplus._M_p =
                           "parser.ParseParameters(argv.size(), argv.data(), error)";
                      conf._M_string_length =
                           (long)"parser.ParseParameters(argv.size(), argv.data(), error)" + 0x37;
                      out_sha_hex._M_string_length._0_1_ = 0;
                      out_sha_hex._M_dataplus._M_p = "<W\x1b";
                      out_sha_hex.field_2._M_allocated_capacity =
                           (size_type)boost::unit_test::lazy_ostream::inst;
                      local_738 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                      ;
                      local_730 = "";
                      pvVar20 = &DAT_00000001;
                      pvVar22 = (iterator)0x0;
                      out_sha_hex.field_2._8_8_ = &conf;
                      boost::test_tools::tt_detail::report_assertion
                                ((assertion_result *)&ignored,(lazy_ostream *)&out_sha_hex,1,0,WARN,
                                 (check_type)in_stack_fffffffffffff6d0,(size_t)&local_738,0x34b);
                      boost::detail::shared_count::~shared_count
                                ((shared_count *)
                                 &ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
                      local_748 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                      ;
                      local_740 = "";
                      local_758 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_750 = &boost::unit_test::basic_cstring<char_const>::null;
                      msg_00.m_end = pvVar22;
                      msg_00.m_begin = pvVar20;
                      file_00.m_end = (iterator)0x34c;
                      file_00.m_begin = (iterator)&local_748;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,
                                 (size_t)&local_758,msg_00);
                      out_sha_hex._M_string_length._0_1_ = 0;
                      out_sha_hex._M_dataplus._M_p = "<W\x1b";
                      out_sha_hex.field_2._M_allocated_capacity =
                           (size_type)boost::unit_test::lazy_ostream::inst;
                      out_sha_hex.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
                      local_768 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                      ;
                      local_760 = "";
                      pcVar9 = "";
                      boost::test_tools::tt_detail::
                      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
                                (&out_sha_hex,&local_768,0x34c,1,2,&error,0xe254e7,"","\"\"");
                      conf._M_dataplus._M_p = (pointer)&conf.field_2;
                      conf._M_string_length = 0;
                      conf.field_2._M_local_buf[0] = '\0';
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&out_sha_hex,"c",(allocator<char> *)local_4e8);
                      psVar19 = &local_2c8;
                      psVar21 = &out_sha_hex;
                      ArgsMergeTestingSetup::GetValues
                                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)&ignored,&this->super_ArgsMergeTestingSetup,
                                 (ActionList *)local_648,(string *)(local_5b8 + lVar15),psVar19,
                                 &out_sha_hex);
                      std::__cxx11::string::~string((string *)&out_sha_hex);
                      uVar6 = ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                      for (pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)ignored._M_t._M_impl._0_8_;
                          pbVar23 !=
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar6
                          ; pbVar23 = pbVar23 + 1) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc," ");
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc,pbVar23);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&conf,pbVar23);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&conf,"\n");
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&ignored);
                      std::__cxx11::istringstream::istringstream
                                ((istringstream *)&out_sha_hex,(string *)&conf,_S_in);
                      local_778 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                      ;
                      local_770 = "";
                      local_788 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_780 = &boost::unit_test::basic_cstring<char_const>::null;
                      msg_01.m_end = (iterator)psVar21;
                      msg_01.m_begin = (iterator)psVar19;
                      file_01.m_end = (iterator)0x356;
                      file_01.m_begin = (iterator)&local_778;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                                 (size_t)&local_788,msg_01);
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&ignored,"filepath",(allocator<char> *)&local_7b8);
                      bVar7 = ArgsManager::ReadConfigStream
                                        ((ArgsManager *)out_sha_bytes,(istream *)&out_sha_hex,
                                         (string *)&ignored,&error,false);
                      local_508._M_p._0_1_ = bVar7;
                      local_500 = (element_type *)0x0;
                      aStack_4f8._M_allocated_capacity = 0;
                      local_798 = "parser.ReadConfigStream(conf_stream, \"filepath\", error)";
                      local_790 = "";
                      local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
                      local_4e8._0_8_ = &PTR__lazy_ostream_0113a070;
                      aStack_4d8._M_allocated_capacity =
                           (size_type)boost::unit_test::lazy_ostream::inst;
                      local_7a8 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                      ;
                      local_7a0 = "";
                      pvVar20 = &DAT_00000001;
                      pvVar22 = (iterator)0x0;
                      aStack_4d8._8_8_ = &local_798;
                      boost::test_tools::tt_detail::report_assertion
                                ((assertion_result *)&local_508,(lazy_ostream *)local_4e8,1,0,WARN,
                                 (check_type)pcVar9,(size_t)&local_7a8,0x356);
                      boost::detail::shared_count::~shared_count
                                ((shared_count *)&aStack_4f8._M_allocated_capacity);
                      std::__cxx11::string::~string((string *)&ignored);
                      local_798 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                      ;
                      local_790 = "";
                      local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
                      local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
                      msg_02.m_end = pvVar22;
                      msg_02.m_begin = pvVar20;
                      file_02.m_end = (iterator)0x357;
                      file_02.m_begin = (iterator)&local_798;
                      boost::unit_test::unit_test_log_t::set_checkpoint
                                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,
                                 (size_t)&local_7b8,msg_02);
                      ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                           ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                           0xffffffffffffff00;
                      ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
                      ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                           (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                      ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                           (_Base_ptr)0xc694e1;
                      local_7c8 = 
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                      ;
                      local_7c0 = "";
                      in_stack_fffffffffffff6d8 = "\"\"";
                      in_stack_fffffffffffff6d0 = "";
                      in_stack_fffffffffffff6c8 = 0xe254e7;
                      in_stack_fffffffffffff6cc = 0;
                      in_R8 = (iterator)0x2;
                      in_R9 = &error;
                      boost::test_tools::tt_detail::
                      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
                                (&ignored,&local_7c8,0x357,1);
                      if (cVar1 != '\0') {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc," soft");
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&ignored,"soft1",(allocator<char> *)local_4e8);
                        ArgsManager::SoftSetArg
                                  ((ArgsManager *)out_sha_bytes,&key,(string *)&ignored);
                        std::__cxx11::string::~string((string *)&ignored);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&ignored,"soft2",(allocator<char> *)local_4e8);
                        ArgsManager::SoftSetArg
                                  ((ArgsManager *)out_sha_bytes,&key,(string *)&ignored);
                        std::__cxx11::string::~string((string *)&ignored);
                      }
                      if (cVar2 != '\0') {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc," force");
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&ignored,"force1",(allocator<char> *)local_4e8);
                        ArgsManager::ForceSetArg
                                  ((ArgsManager *)out_sha_bytes,&key,(string *)&ignored);
                        std::__cxx11::string::~string((string *)&ignored);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&ignored,"force2",(allocator<char> *)local_4e8);
                        ArgsManager::ForceSetArg
                                  ((ArgsManager *)out_sha_bytes,&key,(string *)&ignored);
                        std::__cxx11::string::~string((string *)&ignored);
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&desc," || ");
                      bVar7 = ArgsManager::IsArgSet((ArgsManager *)out_sha_bytes,&key);
                      if (bVar7) {
                        bVar7 = ArgsManager::IsArgNegated((ArgsManager *)out_sha_bytes,&key);
                        if (bVar7) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc,"negated");
                          local_7d8 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_7d0 = "";
                          local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
                          local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
                          msg_03.m_end = (iterator)in_R9;
                          msg_03.m_begin = in_R8;
                          file_03.m_end = (iterator)0x36e;
                          file_03.m_begin = (iterator)&local_7d8;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,
                                     (size_t)&local_7e8,msg_03);
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                               ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                               0xffffffffffffff00;
                          ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                               (_Base_ptr)0xc694e1;
                          local_7f8 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_7f0 = "";
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_508,"default",(allocator<char> *)&local_808);
                          ArgsManager::GetArg((string *)local_4e8,(ArgsManager *)out_sha_bytes,&key,
                                              (string *)&local_508);
                          in_stack_fffffffffffff6d8 = "\"0\"";
                          in_stack_fffffffffffff6d0 = "0";
                          pvVar20 = (iterator)0x2;
                          psVar19 = (string *)local_4e8;
                          boost::test_tools::tt_detail::
                          check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[2]>
                                    (&ignored,&local_7f8,0x36e,1,2,(string *)local_4e8,0xb549b3);
                          std::__cxx11::string::~string((string *)local_4e8);
                          std::__cxx11::string::~string((string *)&local_508);
                          local_808 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_800 = "";
                          local_828._M_left =
                               (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                          local_828._M_right =
                               (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                          msg_04.m_end = (iterator)psVar19;
                          msg_04.m_begin = pvVar20;
                          file_04.m_end = (iterator)0x36f;
                          file_04.m_begin = (iterator)&local_808;
                          boost::unit_test::unit_test_log_t::set_checkpoint
                                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,
                                     (size_t)&local_828._M_left,msg_04);
                          ArgsManager::GetArgs
                                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)&local_508,(ArgsManager *)out_sha_bytes,&key);
                          local_4e8[0] = (class_property<bool>)
                                         (class_property<bool>)
                                         ((element_type *)local_508._M_p == local_500);
                          local_4e8._8_8_ = (element_type *)0x0;
                          aStack_4d8._M_allocated_capacity = 0;
                          local_828._0_8_ = "parser.GetArgs(key).empty()";
                          local_828._M_parent = (_Base_ptr)0xb549ec;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                               ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                               0xffffffffffffff00;
                          ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                               (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                          ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &local_828;
                          local_838 = 
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                          ;
                          local_830 = "";
                          in_stack_fffffffffffff6c8 = 0;
                          in_stack_fffffffffffff6cc = 0;
                          in_R8 = &DAT_00000001;
                          in_R9 = (string *)0x0;
                          boost::test_tools::tt_detail::report_assertion
                                    ((assertion_result *)local_4e8,(lazy_ostream *)&ignored,1,0,WARN
                                     ,(check_type)in_stack_fffffffffffff6d0,(size_t)&local_838,0x36f
                                    );
                          goto LAB_0022fe58;
                        }
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)local_4e8,"default",(allocator<char> *)&local_508);
                        ArgsManager::GetArg((string *)&ignored,(ArgsManager *)out_sha_bytes,&key,
                                            (string *)local_4e8);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc,(string *)&ignored);
                        std::__cxx11::string::~string((string *)&ignored);
                        std::__cxx11::string::~string((string *)local_4e8);
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc," |");
                        ArgsManager::GetArgs
                                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&ignored,(ArgsManager *)out_sha_bytes,&key);
                        uVar6 = ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_;
                        for (pbVar23 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)ignored._M_t._M_impl._0_8_;
                            pbVar23 !=
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            uVar6; pbVar23 = pbVar23 + 1) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc," ");
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc,pbVar23);
                        }
                        this_01 = &ignored;
                      }
                      else {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc,"unset");
                        local_7d8 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_7d0 = "";
                        local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_05.m_end = (iterator)in_R9;
                        msg_05.m_begin = in_R8;
                        file_05.m_end = (iterator)0x369;
                        file_05.m_begin = (iterator)&local_7d8;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                                   (size_t)&local_7e8,msg_05);
                        bVar7 = ArgsManager::IsArgNegated((ArgsManager *)out_sha_bytes,&key);
                        local_4e8._8_8_ = (element_type *)0x0;
                        aStack_4d8._M_allocated_capacity = 0;
                        local_508._M_p = "!parser.IsArgNegated(key)";
                        local_500 = (element_type *)0xb549b2;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                             ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                             0xffffffffffffff00;
                        ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                             (_Base_ptr)&local_508;
                        local_7f8 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_7f0 = "";
                        pvVar20 = &DAT_00000001;
                        pvVar22 = (iterator)0x0;
                        local_4e8[0] = (class_property<bool>)(class_property<bool>)!bVar7;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)local_4e8,(lazy_ostream *)&ignored,1,0,WARN,
                                   (check_type)in_stack_fffffffffffff6d0,(size_t)&local_7f8,0x369);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)&aStack_4d8._M_allocated_capacity);
                        local_808 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_800 = "";
                        local_828._M_left =
                             (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                        local_828._M_right =
                             (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                        msg_06.m_end = pvVar22;
                        msg_06.m_begin = pvVar20;
                        file_06.m_end = (iterator)0x36a;
                        file_06.m_begin = (iterator)&local_808;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                                   (size_t)&local_828._M_left,msg_06);
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                             ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                             0xffffffffffffff00;
                        ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_01139f30;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                             (_Base_ptr)0xc694e1;
                        local_828._0_8_ =
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_828._M_parent = (_Base_ptr)0xb523bf;
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_508,"default",(allocator<char> *)&local_838);
                        ArgsManager::GetArg((string *)local_4e8,(ArgsManager *)out_sha_bytes,&key,
                                            (string *)&local_508);
                        in_stack_fffffffffffff6d8 = "\"default\"";
                        in_stack_fffffffffffff6d0 = "default";
                        pvVar20 = (iterator)0x2;
                        psVar19 = (string *)local_4e8;
                        boost::test_tools::tt_detail::
                        check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[8]>
                                  (&ignored,&local_828,0x36a,1,2,(string *)local_4e8,0xb549b3);
                        std::__cxx11::string::~string((string *)local_4e8);
                        std::__cxx11::string::~string((string *)&local_508);
                        local_838 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_830 = "";
                        local_858._M_left =
                             (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                        local_858._M_right =
                             (_Base_ptr)&boost::unit_test::basic_cstring<char_const>::null;
                        msg_07.m_end = (iterator)psVar19;
                        msg_07.m_begin = pvVar20;
                        file_07.m_end = (iterator)0x36b;
                        file_07.m_begin = (iterator)&local_838;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                                   (size_t)&local_858._M_left,msg_07);
                        ArgsManager::GetArgs
                                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)&local_508,(ArgsManager *)out_sha_bytes,&key);
                        local_4e8[0] = (class_property<bool>)
                                       (class_property<bool>)
                                       ((element_type *)local_508._M_p == local_500);
                        local_4e8._8_8_ = (element_type *)0x0;
                        aStack_4d8._M_allocated_capacity = 0;
                        local_858._0_8_ = "parser.GetArgs(key).empty()";
                        local_858._M_parent = (_Base_ptr)0xb549ec;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                             ignored._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
                             0xffffffffffffff00;
                        ignored._M_t._M_impl._0_8_ = &PTR__lazy_ostream_0113a070;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                             (_Base_ptr)boost::unit_test::lazy_ostream::inst;
                        ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &local_858;
                        local_868 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_860 = "";
                        in_stack_fffffffffffff6c8 = 0;
                        in_stack_fffffffffffff6cc = 0;
                        in_R8 = &DAT_00000001;
                        in_R9 = (string *)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)local_4e8,(lazy_ostream *)&ignored,1,0,WARN,
                                   (check_type)in_stack_fffffffffffff6d0,(size_t)&local_868,0x36b);
LAB_0022fe58:
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)&aStack_4d8._M_allocated_capacity);
                        this_01 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_508;
                      }
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)this_01);
                      ArgsManager::GetUnsuitableSectionOnlyArgs_abi_cxx11_
                                (&ignored,(ArgsManager *)out_sha_bytes);
                      if (ignored._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
                        std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                  (&desc," | ignored");
                        for (p_Var12 = ignored._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                            (_Rb_tree_header *)p_Var12 !=
                            &ignored._M_t._M_impl.super__Rb_tree_header;
                            p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc," ");
                          std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                    (&desc,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)(p_Var12 + 1));
                        }
                      }
                      std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                                (&desc,"\n");
                      CSHA256::Write(&out_sha.sha,(uchar *)desc._M_dataplus._M_p,
                                     desc._M_string_length);
                      if (local_910 != (FILE *)0x0) {
                        local_858._0_8_ =
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_858._M_parent = (_Base_ptr)0xb523bf;
                        local_878 = &boost::unit_test::basic_cstring<char_const>::null;
                        local_870 = &boost::unit_test::basic_cstring<char_const>::null;
                        msg_08.m_end = (iterator)in_R9;
                        msg_08.m_begin = in_R8;
                        file_08.m_end = (iterator)0x386;
                        file_08.m_begin = (iterator)&local_858;
                        boost::unit_test::unit_test_log_t::set_checkpoint
                                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                                   (size_t)&local_878,msg_08);
                        sVar13 = fwrite(desc._M_dataplus._M_p,1,desc._M_string_length,local_910);
                        local_508._M_p._0_1_ = sVar13 == desc._M_string_length;
                        local_500 = (element_type *)0x0;
                        aStack_4f8._M_allocated_capacity = 0;
                        local_888 = "fwrite(desc.data(), 1, desc.size(), out_file) == desc.size()";
                        local_880 = "";
                        local_4e8._8_8_ = local_4e8._8_8_ & 0xffffffffffffff00;
                        local_4e8._0_8_ = &PTR__lazy_ostream_0113a070;
                        aStack_4d8._M_allocated_capacity =
                             (size_type)boost::unit_test::lazy_ostream::inst;
                        aStack_4d8._8_8_ = &local_888;
                        local_898 = 
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
                        ;
                        local_890 = "";
                        in_stack_fffffffffffff6c8 = 0;
                        in_stack_fffffffffffff6cc = 0;
                        in_R8 = (iterator)0x2;
                        in_R9 = (string *)0x0;
                        boost::test_tools::tt_detail::report_assertion
                                  ((assertion_result *)&local_508,(lazy_ostream *)local_4e8,2,0,WARN
                                   ,(check_type)in_stack_fffffffffffff6d0,(size_t)&local_898,0x386);
                        boost::detail::shared_count::~shared_count
                                  ((shared_count *)&aStack_4f8._M_allocated_capacity);
                      }
                      std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~_Rb_tree(&ignored._M_t);
                      std::__cxx11::istringstream::~istringstream((istringstream *)&out_sha_hex);
                      std::__cxx11::string::~string((string *)&conf);
                      std::__cxx11::string::~string((string *)&error);
                      std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                                (&argv.
                                  super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&args);
                      std::__cxx11::string::~string((string *)&key);
                      std::__cxx11::string::~string((string *)&local_2c8);
                      std::__cxx11::string::~string((string *)&desc);
                      std::unique_lock<std::recursive_mutex>::~unique_lock
                                (&criticalblock21.super_unique_lock);
                      ArgsManager::~ArgsManager((ArgsManager *)out_sha_bytes);
                    }
                  }
                  lVar14 = 0x60;
                  do {
                    std::__cxx11::string::~string
                              ((string *)((long)&local_638[0]._M_dataplus._M_p + lVar14));
                    lVar14 = lVar14 + -0x20;
                  } while (lVar14 != -0x20);
                }
                lVar15 = 0x60;
                do {
                  std::__cxx11::string::~string((string *)(local_5b8 + lVar15));
                  lVar15 = lVar15 + -0x20;
                } while (lVar15 != -0x20);
              }
            }
          }
          bVar24 = NextString<argsman_tests::ArgsMergeTestingSetup::Action,3ul>
                             ((Action (*) [3])local_648,SET,SECTION_NEGATE);
          bVar7 = false;
          iVar8 = -1;
          lVar17 = 0;
        } while (bVar24);
      }
      bVar24 = NextString<argsman_tests::ArgsMergeTestingSetup::Action,3ul>
                         ((Action (*) [3])local_658,SET,NEGATE);
      bVar7 = false;
      iVar8 = -1;
      lVar17 = 0;
    } while (bVar24);
    if ((local_910 == (FILE *)0x0) || (iVar8 = fclose(local_910), iVar8 == 0)) {
      output.m_size = 0x20;
      output.m_data = out_sha_bytes;
      CHash256::Finalize(&out_sha,output);
      s.m_size = 0x20;
      s.m_data = out_sha_bytes;
      HexStr_abi_cxx11_(&out_sha_hex,s);
      local_8a8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_8a0 = "";
      local_8b8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
      msg_09.m_end = (iterator)in_R9;
      msg_09.m_begin = in_R8;
      file_09.m_end = (iterator)0x39c;
      file_09.m_begin = (iterator)&local_8a8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_8b8,
                 msg_09);
      local_5b8[8] = 0;
      local_5b8._0_8_ = &PTR__lazy_ostream_01139f30;
      local_5b8._16_8_ = boost::unit_test::lazy_ostream::inst;
      local_5b8._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
      local_8c8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
      ;
      local_8c0 = "";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[65]>
                (local_5b8,&local_8c8,0x39c,1,2,&out_sha_hex,0xb544a0,
                 "f1ee5ab094cc43d16a6086fa7f2c10389e0f99902616b31bbf29189972ad1473",
                 "\"f1ee5ab094cc43d16a6086fa7f2c10389e0f99902616b31bbf29189972ad1473\"");
      std::__cxx11::string::~string((string *)&out_sha_hex);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      goto LAB_002307f5;
    }
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar10 = __errno_location();
    iVar8 = *piVar10;
    peVar11 = (error_category *)std::_V2::generic_category();
    std::system_error::system_error(this_00,iVar8,peVar11,"fclose failed");
  }
  else {
    fs::path::path((path *)out_sha_bytes,pcVar9);
    local_910 = fsbridge::fopen((char *)out_sha_bytes,"w");
    std::filesystem::__cxx11::path::~path((path *)out_sha_bytes);
    if (local_910 != (FILE *)0x0) goto LAB_0022ed24;
    this_00 = (system_error *)__cxa_allocate_exception(0x20);
    piVar10 = __errno_location();
    iVar8 = *piVar10;
    peVar11 = (error_category *)std::_V2::generic_category();
    std::system_error::system_error(this_00,iVar8,peVar11,"fopen failed");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
  }
LAB_002307f5:
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(util_ArgsMerge, ArgsMergeTestingSetup)
{
    CHash256 out_sha;
    FILE* out_file = nullptr;
    if (const char* out_path = getenv("ARGS_MERGE_TEST_OUT")) {
        out_file = fsbridge::fopen(out_path, "w");
        if (!out_file) throw std::system_error(errno, std::generic_category(), "fopen failed");
    }

    ForEachMergeSetup([&](const ActionList& arg_actions, const ActionList& conf_actions, bool soft_set, bool force_set,
                          const std::string& section, const std::string& network, bool net_specific) {
        TestArgsManager parser;
        LOCK(parser.cs_args);

        std::string desc = "net=";
        desc += network;
        parser.m_network = network;

        const std::string& name = net_specific ? "wallet" : "server";
        const std::string key = "-" + name;
        parser.AddArg(key, name, ArgsManager::ALLOW_ANY, OptionsCategory::OPTIONS);
        if (net_specific) parser.SetNetworkOnlyArg(key);

        auto args = GetValues(arg_actions, section, name, "a");
        std::vector<const char*> argv = {"ignored"};
        for (auto& arg : args) {
            arg.insert(0, "-");
            desc += " ";
            desc += arg;
            argv.push_back(arg.c_str());
        }
        std::string error;
        BOOST_CHECK(parser.ParseParameters(argv.size(), argv.data(), error));
        BOOST_CHECK_EQUAL(error, "");

        std::string conf;
        for (auto& conf_val : GetValues(conf_actions, section, name, "c")) {
            desc += " ";
            desc += conf_val;
            conf += conf_val;
            conf += "\n";
        }
        std::istringstream conf_stream(conf);
        BOOST_CHECK(parser.ReadConfigStream(conf_stream, "filepath", error));
        BOOST_CHECK_EQUAL(error, "");

        if (soft_set) {
            desc += " soft";
            parser.SoftSetArg(key, "soft1");
            parser.SoftSetArg(key, "soft2");
        }

        if (force_set) {
            desc += " force";
            parser.ForceSetArg(key, "force1");
            parser.ForceSetArg(key, "force2");
        }

        desc += " || ";

        if (!parser.IsArgSet(key)) {
            desc += "unset";
            BOOST_CHECK(!parser.IsArgNegated(key));
            BOOST_CHECK_EQUAL(parser.GetArg(key, "default"), "default");
            BOOST_CHECK(parser.GetArgs(key).empty());
        } else if (parser.IsArgNegated(key)) {
            desc += "negated";
            BOOST_CHECK_EQUAL(parser.GetArg(key, "default"), "0");
            BOOST_CHECK(parser.GetArgs(key).empty());
        } else {
            desc += parser.GetArg(key, "default");
            desc += " |";
            for (const auto& arg : parser.GetArgs(key)) {
                desc += " ";
                desc += arg;
            }
        }

        std::set<std::string> ignored = parser.GetUnsuitableSectionOnlyArgs();
        if (!ignored.empty()) {
            desc += " | ignored";
            for (const auto& arg : ignored) {
                desc += " ";
                desc += arg;
            }
        }

        desc += "\n";

        out_sha.Write(MakeUCharSpan(desc));
        if (out_file) {
            BOOST_REQUIRE(fwrite(desc.data(), 1, desc.size(), out_file) == desc.size());
        }
    });

    if (out_file) {
        if (fclose(out_file)) throw std::system_error(errno, std::generic_category(), "fclose failed");
        out_file = nullptr;
    }

    unsigned char out_sha_bytes[CSHA256::OUTPUT_SIZE];
    out_sha.Finalize(out_sha_bytes);
    std::string out_sha_hex = HexStr(out_sha_bytes);

    // If check below fails, should manually dump the results with:
    //
    //   ARGS_MERGE_TEST_OUT=results.txt ./test_bitcoin --run_test=argsman_tests/util_ArgsMerge
    //
    // And verify diff against previous results to make sure the changes are expected.
    //
    // Results file is formatted like:
    //
    //   <input> || <IsArgSet/IsArgNegated/GetArg output> | <GetArgs output> | <GetUnsuitable output>
    BOOST_CHECK_EQUAL(out_sha_hex, "f1ee5ab094cc43d16a6086fa7f2c10389e0f99902616b31bbf29189972ad1473");
}